

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t *
Acb_DerivePatchSupportS
          (Cnf_Dat_t *pCnf,int nCiTars,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  int iVar1;
  Vec_Int_t *__ptr;
  int *piVar2;
  satoko_t *s;
  satoko_opts_t *psVar3;
  abctime aVar4;
  ulong uVar5;
  abctime time;
  abctime time_00;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int Lit;
  timespec local_a0;
  int local_8c;
  ulong local_88;
  long local_80;
  uint local_74;
  int local_70;
  int local_6c;
  int local_68;
  uint local_64;
  ulong local_60;
  Vec_Int_t *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 100;
  __ptr->nSize = 0;
  piVar2 = (int *)malloc(400);
  __ptr->pArray = piVar2;
  iVar7 = pCnf->nVars - nCiTars;
  s = satoko_create();
  local_88 = (ulong)(uint)nCoDivs;
  satoko_setnvars(s,nCiTars + nCoDivs + pCnf->nVars * 2);
  psVar3 = satoko_options(s);
  psVar3->no_simplify = '\x01';
  lVar10 = 0;
  while (lVar10 < pCnf->nClauses) {
    piVar2 = pCnf->pClauses[lVar10];
    iVar1 = satoko_add_clause(s,piVar2,(int)((ulong)((long)pCnf->pClauses[lVar10 + 1] - (long)piVar2
                                                    ) >> 2));
    lVar10 = lVar10 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  local_8c = 2;
  iVar1 = satoko_add_clause(s,&local_8c,1);
  if (iVar1 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pCnf->pMan = (Aig_Man_t *)0x0;
  Cnf_DataLift(pCnf,pCnf->nVars);
  lVar10 = 0;
  while (lVar10 < pCnf->nClauses) {
    piVar2 = pCnf->pClauses[lVar10];
    iVar1 = satoko_add_clause(s,piVar2,(int)((ulong)((long)pCnf->pClauses[lVar10 + 1] - (long)piVar2
                                                    ) >> 2));
    lVar10 = lVar10 + 1;
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataLift(pCnf,-pCnf->nVars);
  if (-2 < pCnf->nVars) {
    local_8c = pCnf->nVars * 2 + 2;
    iVar1 = satoko_add_clause(s,&local_8c,1);
    if (iVar1 == 0) {
      return (Vec_Int_t *)0x0;
    }
    if (nCiTars < 1) {
LAB_003959bb:
      uVar9 = (uint)local_88;
      if (0 < (int)uVar9) {
        iVar7 = clock_gettime(3,&local_a0);
        if (iVar7 < 0) {
          local_80 = -1;
        }
        else {
          local_80 = CONCAT44(local_a0.tv_nsec._4_4_,(int)local_a0.tv_nsec) / 1000 +
                     CONCAT44(local_a0.tv_sec._4_4_,(int)local_a0.tv_sec) * 1000000;
        }
        iVar7 = pCnf->nVars;
        local_60 = (ulong)(uint)(nCiTars + iVar7 * 2);
        __ptr->nSize = 0;
        local_74 = 1;
        if (1 < (int)uVar9) {
          local_74 = uVar9;
        }
        local_50 = (ulong)(uint)(nCiTars * 2 + iVar7 * 4);
        local_48 = (ulong)(nCiTars * 2 + iVar7 * 4 + 1);
        uVar8 = 0;
        uVar5 = 0;
        local_58 = __ptr;
        do {
          local_64 = (int)local_60 + (int)uVar5;
          iVar7 = (int)uVar5 + pCnf->nVars;
          uVar9 = iVar7 + 2;
          local_38 = uVar5;
          if ((int)(uVar9 | local_64) < 0) {
            __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x538,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          iVar1 = (int)uVar8;
          iVar6 = (int)local_48 + iVar1;
          local_a0.tv_sec._4_4_ = iVar1 + 5;
          local_88 = CONCAT44(local_88._4_4_,local_a0.tv_sec._4_4_);
          local_a0.tv_nsec._0_4_ = iVar7 + 3 + uVar9;
          local_a0.tv_sec._0_4_ = iVar6;
          local_68 = (int)local_a0.tv_nsec;
          iVar7 = satoko_add_clause(s,(int *)&local_a0,3);
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x53e,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          local_a0.tv_sec._4_4_ = iVar1 + 4;
          local_a0.tv_sec._0_4_ = iVar6;
          local_a0.tv_nsec._0_4_ = uVar9 * 2;
          local_70 = iVar6;
          local_6c = local_a0.tv_sec._4_4_;
          iVar7 = satoko_add_clause(s,(int *)&local_a0,3);
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x544,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          iVar1 = (int)local_50 + iVar1;
          local_a0.tv_sec._4_4_ = (undefined4)local_88;
          local_a0.tv_sec._0_4_ = iVar1;
          local_a0.tv_nsec._0_4_ = uVar9 * 2;
          local_40 = uVar8;
          iVar7 = satoko_add_clause(s,(int *)&local_a0,3);
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x54a,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          local_a0.tv_sec._4_4_ = local_6c;
          local_a0.tv_nsec._0_4_ = local_68;
          local_a0.tv_sec._0_4_ = iVar1;
          iVar7 = satoko_add_clause(s,(int *)&local_a0,3);
          uVar8 = local_40;
          __ptr = local_58;
          if (iVar7 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x550,"int satoko_add_xor(satoko_t *, int, int, int, int)");
          }
          if ((int)local_64 < 0) goto LAB_00395d63;
          Vec_IntPush(local_58,local_70);
          uVar9 = (int)local_38 + 1;
          uVar5 = (ulong)uVar9;
          uVar8 = (ulong)((int)uVar8 + 2);
        } while (local_74 != uVar9);
        piVar2 = __ptr->pArray;
        iVar7 = __ptr->nSize;
        iVar1 = satoko_solve_assumptions(s,piVar2,iVar7);
        if (iVar1 == -1) {
          printf("Proved that the problem has a solution.  ");
          aVar4 = Abc_Clock();
          Abc_PrintTime(0x9ee7ba,(char *)(aVar4 - local_80),time);
          local_88 = Abc_Clock();
          uVar9 = satoko_minimize_assumptions(s,piVar2,iVar7,0);
          if (iVar7 < (int)uVar9) {
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
          }
          __ptr->nSize = uVar9;
          printf("Solved the problem with %d supp vars.  ",(ulong)uVar9);
          aVar4 = Abc_Clock();
          Abc_PrintTime(0x9ee7ba,(char *)(aVar4 - local_88),time_00);
          if (0 < (int)uVar9) {
            uVar5 = 0;
            do {
              if (piVar2[uVar5] < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              piVar2[uVar5] = ((uint)piVar2[uVar5] >> 1) - (int)local_60;
              uVar5 = uVar5 + 1;
            } while (uVar9 != uVar5);
          }
          qsort(piVar2,(long)(int)uVar9,4,Vec_IntSortCompare1);
        }
        else {
          printf("Demonstrated that the problem has NO solution.  ");
          iVar6 = 3;
          iVar7 = clock_gettime(3,&local_a0);
          if (iVar7 < 0) {
            lVar10 = -1;
          }
          else {
            lVar10 = CONCAT44(local_a0.tv_nsec._4_4_,(int)local_a0.tv_nsec) / 1000 +
                     CONCAT44(local_a0.tv_sec._4_4_,(int)local_a0.tv_sec) * 1000000;
          }
          lVar10 = lVar10 - local_80;
          Abc_Print(iVar6,"%s =","Time");
          Abc_Print(iVar6,"%9.2f sec\n",(double)lVar10 / 1000000.0);
          satoko_destroy(s);
          if (piVar2 != (int *)0x0) {
            free(piVar2);
            __ptr->pArray = (int *)0x0;
          }
          free(__ptr);
        }
        if (iVar1 != -1) {
          return (Vec_Int_t *)0x0;
        }
      }
      satoko_destroy(s);
      qsort(__ptr->pArray,(long)__ptr->nSize,4,Vec_IntSortCompare1);
      return __ptr;
    }
    if (-1 < iVar7) {
      local_8c = iVar7 * 2 + 1;
      iVar1 = satoko_add_clause(s,&local_8c,1);
      if (iVar1 == 0) {
        return (Vec_Int_t *)0x0;
      }
      iVar7 = iVar7 + pCnf->nVars;
      if (-1 < iVar7) {
        local_8c = iVar7 * 2;
        iVar7 = satoko_add_clause(s,&local_8c,1);
        if (iVar7 == 0) {
          return (Vec_Int_t *)0x0;
        }
        goto LAB_003959bb;
      }
    }
  }
LAB_00395d63:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupportS( Cnf_Dat_t * pCnf, int nCiTars, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nCiTars;
    satoko_t * pSat = satoko_create();
    satoko_setnvars( pSat, 2 * pCnf->nVars + nCiTars + nCoDivs );
    satoko_options(pSat)->no_simplify = 1;
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !satoko_add_clause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !satoko_add_clause( pSat, &Lit, 1 ) )
        return NULL;
    // create XORs for targets
    if ( nCiTars > 0 )
    {
/*
        int iXorVar = 2 * pCnf->nVars;
        int Lit;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCiTars; i++ )
        {
            satoko_add_xor( pSat, iXorVar+i, iCiVarBeg+i, iCiVarBeg+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iXorVar+i, 0) );
        }
        if ( !satoko_add_clause( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) ) )
            return NULL;
*/
        // add negative literal
        Lit = Abc_Var2Lit( iCiVarBeg, 1 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
        // add positive literal
        Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars, 0 );
        if ( !satoko_add_clause( pSat, &Lit, 1 ) )
            return NULL;
    }
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, status, nSuppNew;
        int iDivVar = 2 * pCnf->nVars + nCiTars;
        Vec_IntClear( vSupp );
        for ( i = 0; i < nCoDivs; i++ )
        {
            satoko_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
/*                
            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             1);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 0);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            pLits[0] = Abc_Var2Lit(iCoVarBeg+1+i,             0);
            pLits[1] = Abc_Var2Lit(iCoVarBeg+1+i+pCnf->nVars, 1);
            pLits[2] = Abc_Var2Lit(iDivVar+i,                 1);
            if ( !satoko_add_clause( pSat, pLits, 3 ) )
                assert( 0 );

            Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 0) );
*/
        }

        // try one run
        status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
        if ( status != l_False )
        {
            printf( "Demonstrated that the problem has NO solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            satoko_destroy( pSat );
            Vec_IntFree( vSupp );
            return NULL;
        }
        assert( status == l_False );
        printf( "Proved that the problem has a solution.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

        // find minimum subset
        if ( fUseMinAssump )
        {
            abctime clk = Abc_Clock();
            nSuppNew = satoko_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            printf( "Solved the problem with %d supp vars.  ", Vec_IntSize(vSupp) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        else
        {
            int * pFinal, nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            Vec_IntClear( vSupp ); 
            for ( i = 0; i < nFinal; i++ )
                Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
            // try one run
            status = satoko_solve_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp) );
            assert( status == l_False );
            // try again
            nFinal = satoko_final_conflict( pSat, &pFinal );
            printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
        }

        // remap them into numbers
        Vec_IntForEachEntry( vSupp, iLit, i )
            Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
        Vec_IntSort( vSupp, 0 );
        //Vec_IntPrint( vSupp );
    }
    satoko_destroy( pSat );
    Vec_IntSort( vSupp, 0 );
    return vSupp;
}